

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

Instr * __thiscall IRBuilder::GenerateLoopBodyStSlot(IRBuilder *this,RegSlot regSlot,uint offset)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  StackSym *pSVar5;
  PropertySym *sym;
  SymOpnd *dstOpnd;
  RegOpnd *src1Opnd;
  Instr *instr;
  
  BVar3 = RegIsConstant(this,regSlot);
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1dfc,"(!this->RegIsConstant((Js::RegSlot)regSlot))",
                       "!this->RegIsConstant((Js::RegSlot)regSlot)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pSVar5 = Func::EnsureLoopParamSym(this->m_func);
  sym = PropertySym::FindOrCreate
                  ((pSVar5->super_Sym).m_id,this->m_loopBodyLocalsStartSlot + regSlot,0xffffffff,
                   0xffffffff,PropertyKindLocalSlots,this->m_func);
  dstOpnd = IR::SymOpnd::New(&sym->super_Sym,TyVar,this->m_func);
  src1Opnd = BuildSrcOpnd(this,regSlot,TyVar);
  instr = IR::Instr::New(StSlot,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  if (offset != 0xffffffff) {
    AddInstr(this,instr,offset);
    instr = (Instr *)0x0;
  }
  return instr;
}

Assistant:

IR::Instr *
IRBuilder::GenerateLoopBodyStSlot(Js::RegSlot regSlot, uint offset)
{
    Assert(!this->RegIsConstant((Js::RegSlot)regSlot));

    StackSym *loopParamSym = m_func->EnsureLoopParamSym();
    PropertySym * fieldSym = PropertySym::FindOrCreate(loopParamSym->m_id, (Js::PropertyId)(regSlot + this->m_loopBodyLocalsStartSlot), (uint32)-1, (uint)-1, PropertyKindLocalSlots, m_func);
    IR::SymOpnd * fieldSymOpnd = IR::SymOpnd::New(fieldSym, TyVar, m_func);

    IR::RegOpnd * regOpnd = this->BuildSrcOpnd((Js::RegSlot)regSlot);
#if !FLOATVAR
    Js::OpCode opcode = Js::OpCode::StSlotBoxTemp;
#else
    Js::OpCode opcode = Js::OpCode::StSlot;
#endif
    IR::Instr * stSlotInstr = IR::Instr::New(opcode, fieldSymOpnd, regOpnd, m_func);
    if (offset != Js::Constants::NoByteCodeOffset)
    {
        this->AddInstr(stSlotInstr, offset);
        return nullptr;
    }
    else
    {
        return stSlotInstr;
    }
}